

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O0

vector sptk::swipe::pitch(matrix S,vector pc,double st)

{
  double dVar1;
  double dVar2;
  __type _Var3;
  vector yr_vector;
  vector yr_vector_00;
  vector yr_vector_01;
  vector coefs_00;
  vector A;
  int iVar4;
  double *in_RCX;
  double *pdVar6;
  long in_RSI;
  undefined8 in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  vector vVar7;
  vector vVar8;
  vector ntc;
  vector s;
  vector coefs;
  double tc2;
  double log2pc;
  double maxv;
  double nftc;
  int search;
  int maxi;
  int j;
  int i;
  vector p;
  double in_stack_fffffffffffffee8;
  undefined4 uVar9;
  int __x;
  double in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  double *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  double *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff6c;
  double local_58;
  int local_44;
  int local_40;
  int local_3c;
  int local_20;
  int iStack_1c;
  double *pdVar5;
  
  local_44 = -1;
  dVar1 = log2(in_RCX[2]);
  uVar9 = SUB84(dVar1,0);
  __x = (int)((ulong)dVar1 >> 0x20);
  dVar1 = log2(*in_RCX);
  dVar1 = round(((double)CONCAT44(__x,uVar9) - dVar1) / 0.0013028 + 1.0);
  dVar2 = 1.0 / in_RCX[1];
  vVar7 = makev(0);
  pdVar5 = vVar7.v;
  vVar7 = makev(0);
  pdVar6 = vVar7.v;
  iVar4 = vVar7.x;
  *pdVar6 = ((1.0 / *in_RCX) / dVar2 - 1.0) * 2.0 * 3.141592653589793;
  pdVar6[1] = (dVar2 / dVar2 - 1.0) * 2.0 * 3.141592653589793;
  pdVar6[2] = ((1.0 / in_RCX[2]) / dVar2 - 1.0) * 2.0 * 3.141592653589793;
  vVar7 = makev(0);
  for (local_40 = 0; iStack_1c = (int)((ulong)in_RDI >> 0x20), local_40 < iStack_1c;
      local_40 = local_40 + 1) {
    local_58 = -32768.0;
    for (local_3c = 0; local_20 = (int)in_RDI, local_3c < local_20; local_3c = local_3c + 1) {
      if (local_58 < *(double *)(*(long *)(in_RSI + (long)local_3c * 8) + (long)local_40 * 8)) {
        local_58 = *(double *)(*(long *)(in_RSI + (long)local_3c * 8) + (long)local_40 * 8);
        local_44 = local_3c;
      }
    }
    if (local_58 <= (double)CONCAT44(in_XMM0_Db,in_XMM0_Da)) {
      vVar7.v[local_40] = 0.0;
    }
    else if ((local_44 == 0) || (local_44 == local_20 + -1)) {
      vVar7.v[local_40] = *in_RCX;
    }
    else {
      log2(in_RCX[local_44 + -1]);
      *pdVar5 = *(double *)(*(long *)(in_RSI + (long)(local_44 + -1) * 8) + (long)local_40 * 8);
      pdVar5[1] = *(double *)(*(long *)(in_RSI + (long)local_44 * 8) + (long)local_40 * 8);
      pdVar5[2] = *(double *)(*(long *)(in_RSI + (long)(local_44 + 1) * 8) + (long)local_40 * 8);
      A._4_4_ = in_stack_ffffffffffffff6c;
      A.x = iVar4;
      A.v = pdVar6;
      vVar8._4_4_ = in_stack_ffffffffffffff5c;
      vVar8.x = in_stack_ffffffffffffff58;
      vVar8.v = in_stack_ffffffffffffff60;
      vVar8 = polyfit(A,vVar8,(int)((ulong)pdVar6 >> 0x20));
      in_stack_ffffffffffffff60 = vVar8.v;
      in_stack_ffffffffffffff58 = vVar8.x;
      local_58 = -32768.0;
      for (local_3c = 0; local_3c < (int)dVar1; local_3c = local_3c + 1) {
        std::pow<int,double>(__x,in_stack_fffffffffffffee8);
        coefs_00.v = in_stack_ffffffffffffff10;
        coefs_00._0_8_ = in_stack_ffffffffffffff08;
        dVar2 = polyval(coefs_00,in_stack_ffffffffffffff00);
        if (local_58 < dVar2) {
          local_44 = local_3c;
          local_58 = dVar2;
        }
      }
      yr_vector.v._0_4_ = uVar9;
      yr_vector._0_8_ = in_stack_fffffffffffffee8;
      yr_vector.v._4_4_ = __x;
      freev(yr_vector);
      _Var3 = std::pow<int,double>(__x,in_stack_fffffffffffffee8);
      vVar7.v[local_40] = _Var3;
    }
  }
  yr_vector_00.v._0_4_ = uVar9;
  yr_vector_00._0_8_ = in_stack_fffffffffffffee8;
  yr_vector_00.v._4_4_ = __x;
  freev(yr_vector_00);
  yr_vector_01.v._0_4_ = uVar9;
  yr_vector_01._0_8_ = in_stack_fffffffffffffee8;
  yr_vector_01.v._4_4_ = __x;
  freev(yr_vector_01);
  vVar7._4_4_ = 0;
  return vVar7;
}

Assistant:

vector pitch(matrix S, vector pc, double st) {
    int i, j;
    int maxi = -1;
    int search = (int) round((log2(pc.v[2]) - log2(pc.v[0])) / POLYV + 1.);
    double nftc, maxv, log2pc;
    double tc2 = 1. / pc.v[1];
    vector coefs;
    vector s = makev(3);
    vector ntc = makev(3);
    ntc.v[0] = ((1. / pc.v[0]) / tc2 - 1.) * 2. * M_PI; 
    ntc.v[1] = (tc2 / tc2 - 1.) * 2. * M_PI; 
    ntc.v[2] = ((1. / pc.v[2]) / tc2 - 1.) * 2. * M_PI;
    vector p = makev(S.y);  
    for (j = 0; j < S.y; j++) {
        maxv = SHRT_MIN;  
        for (i = 0; i < S.x; i++) {
            if (S.m[i][j] > maxv) {
                maxv = S.m[i][j];
                maxi = i;
            }
        }
        if (maxv > st) { // make sure it's big enough
            if (maxi == 0 || maxi == S.x - 1) p.v[j] = pc.v[0];
            else { // general case
                tc2 = 1. / pc.v[maxi];
                log2pc = log2(pc.v[maxi - 1]); 
                s.v[0] = S.m[maxi - 1][j];
                s.v[1] = S.m[maxi][j];
                s.v[2] = S.m[maxi + 1][j]; 
                coefs = polyfit(ntc, s, 2); 
                maxv = SHRT_MIN; 
                for (i = 0; i < search; i++) { // check the nftc space
                    nftc = polyval(coefs, ((1. / pow(2, i * POLYV + 
                                   log2pc)) / tc2 - 1) * 2 * M_PI);
                    if (nftc > maxv) {
                        maxv = nftc;
                        maxi = i;
                    }
                } // now we've got the pitch numbers we need
                freev(coefs);
                p.v[j] = pow(2, log2pc + (maxi * POLYV));
            }
        }
        else 
#if 0
            p.v[j] = NAN;
#else
            p.v[j] = 0.0;
#endif
    }
    freev(ntc);
    freev(s);
    return(p);
}